

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::PollSocket(RTPTCPTransmitter *this,SocketType sock,SocketData *sdata)

{
  byte bVar1;
  uint8_t *puVar2;
  int availLen;
  SocketType sock_00;
  RTPMemoryManager *pRVar3;
  RTPAddress *pRVar4;
  RTPRawPacket *this_00;
  size_t sVar5;
  RTPRawPacket *local_90;
  RTPRawPacket *pPack;
  uint8_t *puStack_80;
  uint8_t packettype;
  RTCPCommonHeader *rtcpheader;
  bool isrtp;
  RTPAddress *local_68;
  RTPTCPAddress *pAddr;
  uint8_t *puStack_58;
  int dataLength;
  uint8_t *pBuf;
  bool local_45;
  int status;
  bool complete;
  RTPTime RStack_40;
  int relevantLen;
  RTPTime curtime;
  long lStack_30;
  bool dataavailable;
  size_t len;
  SocketData *sdata_local;
  RTPTCPTransmitter *pRStack_18;
  SocketType sock_local;
  RTPTCPTransmitter *this_local;
  
  len = (size_t)sdata;
  sdata_local._4_4_ = sock;
  pRStack_18 = this;
  do {
    lStack_30 = 0;
    ioctl(sdata_local._4_4_,0x541b,&stack0xffffffffffffffd0);
    curtime.m_t._7_1_ = lStack_30 != 0;
    if ((bool)curtime.m_t._7_1_) {
      RStack_40 = RTPTime::CurrentTime();
      sock_00 = sdata_local._4_4_;
      sVar5 = len;
      status = 0x10001;
      if ((int)lStack_30 < 0x10001) {
        status = (int)lStack_30;
      }
      availLen = status;
      local_45 = false;
      pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      pBuf._4_4_ = SocketData::ProcessAvailableBytes
                             ((SocketData *)sVar5,sock_00,availLen,&local_45,pRVar3);
      if (pBuf._4_4_ < 0) {
        return pBuf._4_4_;
      }
      if (((local_45 & 1U) != 0) &&
         (puStack_58 = SocketData::ExtractDataBuffer((SocketData *)len),
         puStack_58 != (uint8_t *)0x0)) {
        pAddr._4_4_ = *(int *)(len + 8);
        SocketData::Reset((SocketData *)len);
        pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        pRVar4 = (RTPAddress *)operator_new(0x10,pRVar3,0x17);
        RTPTCPAddress::RTPTCPAddress((RTPTCPAddress *)pRVar4,sdata_local._4_4_);
        if (pRVar4 == (RTPAddress *)0x0) {
          return -1;
        }
        rtcpheader._3_1_ = 1;
        if (4 < pAddr._4_4_) {
          puStack_80 = puStack_58;
          pPack._7_1_ = puStack_58[1];
          if ((199 < pPack._7_1_) && (pPack._7_1_ < 0xcd)) {
            rtcpheader._3_1_ = 0;
          }
        }
        local_68 = pRVar4;
        pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        this_00 = (RTPRawPacket *)operator_new(0x38,pRVar3,0x1b);
        puVar2 = puStack_58;
        pRVar4 = local_68;
        bVar1 = rtcpheader._3_1_;
        sVar5 = (size_t)pAddr._4_4_;
        pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPRawPacket::RTPRawPacket
                  (this_00,puVar2,sVar5,pRVar4,&stack0xffffffffffffffc0,(bool)(bVar1 & 1),pRVar3);
        pRVar4 = local_68;
        local_90 = this_00;
        if (this_00 == (RTPRawPacket *)0x0) {
          pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDelete<jrtplib::RTPTCPAddress>((RTPTCPAddress *)pRVar4,pRVar3);
          puVar2 = puStack_58;
          pRVar3 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray(puVar2,pRVar3);
          return -1;
        }
        std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
        push_back(&this->m_rawpacketlist,&local_90);
      }
    }
    if ((curtime.m_t._7_1_ & 1) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int RTPTCPTransmitter::PollSocket(SocketType sock, SocketData &sdata)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	unsigned long len;
#else 
	size_t len;
#endif // RTP_SOCKETTYPE_WINSOCK
	bool dataavailable;
	
	do
	{
		len = 0;
		RTPIOCTL(sock, FIONREAD, &len);

		if (len <= 0) 
			dataavailable = false;
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			int relevantLen = RTPTCPTRANS_MAXPACKSIZE+2;
			
			if ((int)len < relevantLen)
				relevantLen = (int)len;

			bool complete = false;
			int status = sdata.ProcessAvailableBytes(sock, relevantLen, complete, GetMemoryManager());
			if (status < 0)
				return status;
			
			if (complete)
			{
				uint8_t *pBuf = sdata.ExtractDataBuffer();
				if (pBuf)
				{
					int dataLength = sdata.m_dataLength;
					sdata.Reset();

					RTPTCPAddress *pAddr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(sock);
					if (pAddr == 0)
						return ERR_RTP_OUTOFMEM;

					bool isrtp = true;
					if (dataLength > (int)sizeof(RTCPCommonHeader))
					{
						RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)pBuf;
						uint8_t packettype = rtcpheader->packettype;

						if (packettype >= 200 && packettype <= 204)
							isrtp = false;
					}
						
					RTPRawPacket *pPack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(pBuf, dataLength, pAddr, curtime, isrtp, GetMemoryManager());
					if (pPack == 0)
					{
						RTPDelete(pAddr,GetMemoryManager());
						RTPDeleteByteArray(pBuf,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					m_rawpacketlist.push_back(pPack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}